

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbolize.cpp
# Opt level: O1

bool __thiscall WTF::LineReader::ReadLine(LineReader *this,char **bol,char **eol)

{
  char *pcVar1;
  void *pvVar2;
  ssize_t sVar3;
  char *pcVar4;
  size_t __n;
  char *__s;
  
  pcVar4 = this->buf_;
  pcVar1 = this->eod_;
  if (pcVar4 == pcVar1) {
    sVar3 = ReadPersistent(this->fd_,pcVar4,(long)this->buf_len_);
    if (sVar3 < 1) {
      return false;
    }
    this->eod_ = this->buf_ + sVar3;
    this->bol_ = this->buf_;
  }
  else {
    __s = this->eol_ + 1;
    this->bol_ = __s;
    if (pcVar1 < __s) {
      abort();
    }
    pvVar2 = memchr(__s,10,(long)pcVar1 - (long)__s);
    if (pvVar2 == (void *)0x0) {
      __n = (size_t)((int)pcVar1 - (int)__s);
      memmove(pcVar4,__s,__n);
      pcVar4 = this->buf_;
      sVar3 = ReadPersistent(this->fd_,pcVar4 + __n,(long)this->buf_len_ - __n);
      if (sVar3 < 1) {
        return false;
      }
      this->eod_ = pcVar4 + __n + sVar3;
      this->bol_ = this->buf_;
    }
  }
  pcVar4 = (char *)memchr(this->bol_,10,(long)this->eod_ - (long)this->bol_);
  this->eol_ = pcVar4;
  if (pcVar4 == (char *)0x0) {
    return false;
  }
  *pcVar4 = '\0';
  *bol = this->bol_;
  *eol = this->eol_;
  return true;
}

Assistant:

bool ReadLine(const char **bol, const char **eol) {
    if (BufferIsEmpty()) {  // First time.
      const ssize_t num_bytes = ReadPersistent(fd_, buf_, buf_len_);
      if (num_bytes <= 0) {  // EOF or error.
        return false;
      }
      eod_ = buf_ + num_bytes;
      bol_ = buf_;
    } else {
      bol_ = eol_ + 1;  // Advance to the next line in the buffer.
      SAFE_ASSERT(bol_ <= eod_);  // "bol_" can point to "eod_".
      if (!HasCompleteLine()) {
        const int incomplete_line_length = eod_ - bol_;
        // Move the trailing incomplete line to the beginning.
        memmove(buf_, bol_, incomplete_line_length);
        // Read text from file and append it.
        char * const append_pos = buf_ + incomplete_line_length;
        const int capacity_left = buf_len_ - incomplete_line_length;
        const ssize_t num_bytes = ReadPersistent(fd_, append_pos,
                                                 capacity_left);
        if (num_bytes <= 0) {  // EOF or error.
          return false;
        }
        eod_ = append_pos + num_bytes;
        bol_ = buf_;
      }
    }
    eol_ = FindLineFeed();
    if (eol_ == NULL) {  // '\n' not found.  Malformed line.
      return false;
    }
    *eol_ = '\0';  // Replace '\n' with '\0'.

    *bol = bol_;
    *eol = eol_;
    return true;
  }